

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O3

CBString * phoenixFlashMapGuidToUString(CBString *__return_storage_ptr__,EFI_GUID *guid)

{
  int iVar1;
  char *s;
  UByteArray baGuid;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,guid,guid + 1);
  if (local_38 == NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER.d._M_string_length) {
    s = "Volume header";
    if (local_38 != 0) {
      iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER.d._M_dataplus._M_p,local_38);
      if (iVar1 != 0) goto LAB_00112f1b;
    }
  }
  else {
LAB_00112f1b:
    if (local_38 == NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID.d._M_string_length) {
      s = "Microcodes";
      if (local_38 != 0) {
        iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID.d._M_dataplus._M_p,local_38);
        if (iVar1 != 0) goto LAB_00112f50;
      }
    }
    else {
LAB_00112f50:
      if (local_38 == NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID.d._M_string_length) {
        s = "CMDB";
        if (local_38 != 0) {
          iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID.d._M_dataplus._M_p,local_38);
          if (iVar1 != 0) goto LAB_00112f85;
        }
      }
      else {
LAB_00112f85:
        if (local_38 == NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID.d._M_string_length) {
          s = "SLIC pubkey";
          if (local_38 != 0) {
            iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID.d._M_dataplus._M_p,local_38);
            if (iVar1 != 0) goto LAB_00112fba;
          }
        }
        else {
LAB_00112fba:
          if (local_38 == NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID.d._M_string_length) {
            s = "SLIC pubkey";
            if (local_38 != 0) {
              iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID.d._M_dataplus._M_p,local_38
                          );
              if (iVar1 != 0) goto LAB_00112fef;
            }
          }
          else {
LAB_00112fef:
            if (local_38 == NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID.d._M_string_length) {
              s = "SLIC marker";
              if (local_38 != 0) {
                iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID.d._M_dataplus._M_p,
                             local_38);
                if (iVar1 != 0) goto LAB_00113024;
              }
            }
            else {
LAB_00113024:
              if (local_38 == NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID.d._M_string_length) {
                s = "SLIC marker";
                if (local_38 != 0) {
                  iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID.d._M_dataplus._M_p,
                               local_38);
                  if (iVar1 != 0) goto LAB_00113059;
                }
              }
              else {
LAB_00113059:
                if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID.d._M_string_length) {
                  s = "EVSA store";
                  if (local_38 != 0) {
                    iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID.d._M_dataplus._M_p,
                                 local_38);
                    if (iVar1 != 0) goto LAB_0011308e;
                  }
                }
                else {
LAB_0011308e:
                  if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID.d._M_string_length) {
                    s = "EVSA store";
                    if (local_38 != 0) {
                      iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID.d._M_dataplus._M_p,
                                   local_38);
                      if (iVar1 != 0) goto LAB_001130c3;
                    }
                  }
                  else {
LAB_001130c3:
                    if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID.d._M_string_length) {
                      s = "EVSA store";
                      if (local_38 != 0) {
                        iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID.d._M_dataplus._M_p,
                                     local_38);
                        if (iVar1 != 0) goto LAB_001130f8;
                      }
                    }
                    else {
LAB_001130f8:
                      if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID.d._M_string_length) {
                        s = "EVSA store";
                        if (local_38 != 0) {
                          iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID.d._M_dataplus.
                                                _M_p,local_38);
                          if (iVar1 != 0) goto LAB_0011312d;
                        }
                      }
                      else {
LAB_0011312d:
                        if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID.d._M_string_length) {
                          s = "EVSA store";
                          if (local_38 != 0) {
                            iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID.d._M_dataplus.
                                                  _M_p,local_38);
                            if (iVar1 != 0) goto LAB_00113162;
                          }
                        }
                        else {
LAB_00113162:
                          if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID.d._M_string_length) {
                            s = "EVSA store";
                            if (local_38 != 0) {
                              iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID.d._M_dataplus
                                                    ._M_p,local_38);
                              if (iVar1 != 0) goto LAB_00113197;
                            }
                          }
                          else {
LAB_00113197:
                            if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID.d._M_string_length) {
                              s = "EVSA store";
                              if (local_38 != 0) {
                                iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID.d.
                                                      _M_dataplus._M_p,local_38);
                                if (iVar1 != 0) goto LAB_001131c4;
                              }
                            }
                            else {
LAB_001131c4:
                              if (local_38 == NVRAM_PHOENIX_FLASH_MAP_SELF_GUID.d._M_string_length)
                              {
                                s = "Flash map";
                                if (local_38 != 0) {
                                  iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_SELF_GUID.d.
                                                        _M_dataplus._M_p,local_38);
                                  if (iVar1 != 0) goto LAB_001131f1;
                                }
                              }
                              else {
LAB_001131f1:
                                s = "Unknown";
                                if (local_38 == ZERO_GUID.d._M_string_length) {
                                  if (local_38 != 0) {
                                    iVar1 = bcmp(local_40,ZERO_GUID.d._M_dataplus._M_p,local_38);
                                    if (iVar1 != 0) goto LAB_0011321e;
                                  }
                                  Bstrlib::CBString::CBString(__return_storage_ptr__);
                                  goto LAB_00113229;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011321e:
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
LAB_00113229:
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

UString phoenixFlashMapGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER)        return UString("Volume header");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID)      return UString("Microcodes");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID)            return UString("CMDB");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID)      return UString("SLIC pubkey");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID)      return UString("SLIC marker");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID)        return UString("EVSA store");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_SELF_GUID)            return UString("Flash map");
    if (baGuid == ZERO_GUID)                                    return UString();
    return UString("Unknown");
}